

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O3

void __thiscall duckdb::ErrorData::ErrorData(ErrorData *this,string *message)

{
  string *this_00;
  key_type *__k;
  ExceptionType EVar1;
  int iVar2;
  pointer this_01;
  mapped_type *pmVar3;
  long lVar4;
  _Hash_node_base *p_Var5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  info;
  string local_a8;
  string local_88;
  undefined1 local_68 [56];
  
  this->initialized = true;
  this->type = INVALID;
  this_00 = &this->raw_message;
  (this->raw_message)._M_dataplus._M_p = (pointer)&(this->raw_message).field_2;
  (this->raw_message)._M_string_length = 0;
  (this->raw_message).field_2._M_local_buf[0] = '\0';
  (this->final_message)._M_dataplus._M_p = (pointer)&(this->final_message).field_2;
  (this->final_message)._M_string_length = 0;
  (this->final_message).field_2._M_local_buf[0] = '\0';
  (this->extra_info)._M_h._M_buckets = &(this->extra_info)._M_h._M_single_bucket;
  (this->extra_info)._M_h._M_bucket_count = 1;
  (this->extra_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extra_info)._M_h._M_element_count = 0;
  (this->extra_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extra_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extra_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((message->_M_string_length == 0) || (*(message->_M_dataplus)._M_p != '{')) {
    local_68._0_8_ = exp2;
    ::std::bad_alloc::what();
    iVar2 = ::std::__cxx11::string::compare((char *)message);
    ::std::bad_alloc::~bad_alloc((bad_alloc *)local_68);
    if (iVar2 == 0) {
      this->type = OUT_OF_MEMORY;
      ::std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->raw_message)._M_string_length,0x1de591e);
    }
    else {
      ::std::__cxx11::string::_M_assign((string *)this_00);
    }
  }
  else {
    StringUtil::ParseJSONMap((StringUtil *)&local_a8,message,false);
    this_01 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
              operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                          *)&local_a8);
    ComplexJSON::Flatten_abi_cxx11_
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_68,this_01);
    ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
              ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)
               &local_a8);
    if ((_Hash_node_base *)local_68._16_8_ != (_Hash_node_base *)0x0) {
      p_Var5 = (_Hash_node_base *)local_68._16_8_;
      do {
        __k = (key_type *)(p_Var5 + 1);
        iVar2 = ::std::__cxx11::string::compare((char *)__k);
        if (iVar2 == 0) {
          lVar4 = 0;
          do {
            iVar2 = ::std::__cxx11::string::compare((char *)(p_Var5 + 5));
            if (iVar2 == 0) {
              EVar1 = (&EXCEPTION_MAP)[lVar4];
              goto LAB_013ee8a2;
            }
            lVar4 = lVar4 + 0x31;
          } while (lVar4 != 0x80a);
          EVar1 = INVALID;
LAB_013ee8a2:
          this->type = EVar1;
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar2 == 0) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,p_Var5[5]._M_nxt,
                       (long)&(p_Var5[5]._M_nxt)->_M_nxt + (long)&(p_Var5[6]._M_nxt)->_M_nxt);
            SanitizeErrorMessage(&local_a8,&local_88);
            ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
          }
          else {
            pmVar3 = ::std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&this->extra_info,__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar3);
          }
        }
        p_Var5 = p_Var5->_M_nxt;
      } while (p_Var5 != (_Hash_node_base *)0x0);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_68);
  }
  ConstructFinalMessage_abi_cxx11_((string *)local_68,this);
  ::std::__cxx11::string::operator=((string *)&this->final_message,(string *)local_68);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  return;
}

Assistant:

ErrorData::ErrorData(const string &message)
    : initialized(true), type(ExceptionType::INVALID), raw_message(string()), final_message(string()) {

	// parse the constructed JSON
	if (message.empty() || message[0] != '{') {
		// not JSON! Use the message as a raw Exception message and leave type as uninitialized

		if (message == std::bad_alloc().what()) {
			type = ExceptionType::OUT_OF_MEMORY;
			raw_message = "Allocation failure";
		} else {
			raw_message = message;
		}
	} else {
		auto info = StringUtil::ParseJSONMap(message)->Flatten();
		for (auto &entry : info) {
			if (entry.first == "exception_type") {
				type = Exception::StringToExceptionType(entry.second);
			} else if (entry.first == "exception_message") {
				raw_message = SanitizeErrorMessage(entry.second);
			} else {
				extra_info[entry.first] = entry.second;
			}
		}
	}

	final_message = ConstructFinalMessage();
}